

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InstructionFolder::UnaryOperate(InstructionFolder *this,Op opcode,uint32_t operand)

{
  uint32_t uVar1;
  int32_t s_operand;
  uint32_t operand_local;
  Op opcode_local;
  InstructionFolder *this_local;
  
  this_local._4_4_ = operand;
  if ((opcode != OpUConvert) && (opcode != OpSConvert)) {
    if (opcode == OpSNegate) {
      uVar1 = std::numeric_limits<int>::min();
      if (operand != uVar1) {
        this_local._4_4_ = -operand;
      }
    }
    else if (opcode == OpLogicalNot) {
      this_local._4_4_ = (uint)((operand != 0 ^ 0xffU) & 1);
    }
    else {
      if (opcode != OpNot) {
        __assert_fail("false && \"Unsupported unary operation for OpSpecConstantOp instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                      ,0x41,
                      "uint32_t spvtools::opt::InstructionFolder::UnaryOperate(spv::Op, uint32_t) const"
                     );
      }
      this_local._4_4_ = operand ^ 0xffffffff;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t InstructionFolder::UnaryOperate(spv::Op opcode,
                                         uint32_t operand) const {
  switch (opcode) {
    // Arthimetics
    case spv::Op::OpSNegate: {
      int32_t s_operand = static_cast<int32_t>(operand);
      if (s_operand == std::numeric_limits<int32_t>::min()) {
        return s_operand;
      }
      return -s_operand;
    }
    case spv::Op::OpNot:
      return ~operand;
    case spv::Op::OpLogicalNot:
      return !static_cast<bool>(operand);
    case spv::Op::OpUConvert:
      return operand;
    case spv::Op::OpSConvert:
      return operand;
    default:
      assert(false &&
             "Unsupported unary operation for OpSpecConstantOp instruction");
      return 0u;
  }
}